

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_169ea0::TooHigh::~TooHigh(TooHigh *this)

{
  FIX::FieldBase::~FieldBase((FieldBase *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

static void fillHeaderTrailer(FIX44::Message &message) {
  message.getHeader().set(FIX::BodyLength(0));
  message.getHeader().set(SenderCompID("FIXTEST"));
  message.getHeader().set(TargetCompID("TW"));
  message.getHeader().set(MsgSeqNum(1));
  message.getHeader().set(SendingTime(UtcTimeStamp::now()));
  message.getTrailer().set(CheckSum(0));
}